

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O2

string * hiberlite::Database::getClassName<Person>(void)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string *in_RDI;
  char local_b [2];
  allocator local_9;
  
  std::__cxx11::string::string((string *)in_RDI,"Person",&local_9);
  __first._M_current = (in_RDI->_M_dataplus)._M_p;
  local_b[1] = 0x3a;
  local_b[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + in_RDI->_M_string_length),local_b + 1,local_b);
  return in_RDI;
}

Assistant:

void createDB()
{
  hiberlite::Database db("sample.db");
  //register bean classes
  db.registerBeanClass<Person>();
  //drop all tables beans will use
  db.dropModel();
  //create those tables again with proper schema
  db.createModel();

  const char* names[5]={"Stanley Marsh", "Kyle Broflovski", "Eric Theodore Cartman", "Kenneth McCormick", "Leopold Stotch"};

  for(unsigned int i=0;i<5;i++) {
    Person x;
    x.name=names[i%5];
    x.age=14+i*0.1;
    x.bio.push_back("Hello");
    x.bio.push_back("world");
    x.bio.push_back("!");

    hiberlite::bean_ptr<Person> p=db.copyBean(x);	//create a managed copy of the object
  }
}